

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::ClientImpl::handle_request
          (ClientImpl *this,Stream *strm,Request *req,Response *res,bool close_connection,
          Error *error)

{
  undefined8 cnonce_count;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *__s;
  ulong uVar4;
  size_t length;
  int __flags;
  string *cnonce;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9c8;
  undefined1 local_998 [8];
  Response new_res;
  string local_888;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_868;
  allocator<char> local_821;
  key_type local_820;
  undefined1 local_800 [8];
  Request new_req;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  auth;
  string *password;
  string *username;
  undefined1 local_558 [3];
  bool is_proxy;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  undefined1 local_518 [8];
  Request req2;
  bool local_2a1;
  undefined1 local_2a0 [7];
  bool ret;
  Request req_save;
  Error *error_local;
  bool close_connection_local;
  Response *res_local;
  Request *req_local;
  Stream *strm_local;
  ClientImpl *this_local;
  
  req_save.authorization_count_ = (size_t)error;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&req->path);
  if (bVar1) {
    *(undefined4 *)req_save.authorization_count_ = 2;
    this_local._7_1_ = false;
  }
  else {
    Request::Request((Request *)local_2a0,req);
    uVar3 = (*this->_vptr_ClientImpl[6])();
    if ((((uVar3 & 1) != 0) ||
        (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 empty(&this->proxy_host_), bVar1)) || (this->proxy_port_ == -1)) {
      local_2a1 = process_request(this,strm,req,res,close_connection,
                                  (Error *)req_save.authorization_count_);
    }
    else {
      Request::Request((Request *)local_518,req);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558,
                     "http://",&this->host_and_port_);
      std::operator+(&local_538,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558,
                     &req->path);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&req2.method.field_2 + 8),&local_538);
      std::__cxx11::string::~string((string *)&local_538);
      std::__cxx11::string::~string((string *)local_558);
      local_2a1 = process_request(this,strm,(Request *)local_518,res,close_connection,
                                  (Error *)req_save.authorization_count_);
      Request::operator=(req,(Request *)local_518);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&req->path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&req_save.method.field_2 + 8));
      Request::~Request((Request *)local_518);
    }
    if (local_2a1 == false) {
      this_local._7_1_ = false;
    }
    else {
      if (((300 < res->status) && (res->status < 400)) && ((this->follow_location_ & 1U) != 0)) {
        Request::operator=(req,(Request *)local_2a0);
        local_2a1 = redirect(this,req,res,(Error *)req_save.authorization_count_);
      }
      if (((res->status == 0x191) || (res->status == 0x197)) && (req->authorization_count_ < 5)) {
        bVar1 = res->status == 0x197;
        if (bVar1) {
          this_00 = &this->proxy_digest_auth_username_;
          local_9c8 = &this->proxy_digest_auth_password_;
        }
        else {
          this_00 = &this->digest_auth_username_;
          local_9c8 = &this->digest_auth_password_;
        }
        bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty(this_00);
        if ((!bVar2) &&
           (bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::empty(local_9c8), !bVar2)) {
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&new_req.authorization_count_);
          bVar2 = detail::parse_www_authenticate
                            (res,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&new_req.authorization_count_,bVar1);
          if (bVar2) {
            Request::Request((Request *)local_800,req);
            new_req._592_8_ = new_req._592_8_ + 1;
            __s = "Authorization";
            if (bVar1) {
              __s = "Proxy-Authorization";
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_820,__s,&local_821);
            std::
            multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::erase((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)((long)&new_req.path.field_2 + 8),&local_820);
            std::__cxx11::string::~string((string *)&local_820);
            std::allocator<char>::~allocator(&local_821);
            cnonce_count = new_req._592_8_;
            detail::random_string_abi_cxx11_(&local_888,(detail *)0xa,length);
            cnonce = &local_888;
            detail::make_digest_authentication_header
                      (&local_868,req,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&new_req.authorization_count_,cnonce_count,cnonce,this_00,local_9c8,bVar1)
            ;
            __flags = (int)cnonce;
            new_res._256_8_ =
                 std::
                 multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                 ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                           ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                             *)(new_req.path.field_2._M_local_buf + 8),&local_868);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair(&local_868);
            std::__cxx11::string::~string((string *)&local_888);
            Response::Response((Response *)local_998);
            uVar4 = send(this,(int)local_800,(Response *)local_998,req_save.authorization_count_,
                         __flags);
            local_2a1 = (bool)((byte)uVar4 & 1);
            if ((uVar4 & 1) != 0) {
              Response::operator=(res,(Response *)local_998);
            }
            Response::~Response((Response *)local_998);
            Request::~Request((Request *)local_800);
          }
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&new_req.authorization_count_);
        }
      }
      this_local._7_1_ = local_2a1;
    }
    Request::~Request((Request *)local_2a0);
  }
  return this_local._7_1_;
}

Assistant:

inline bool ClientImpl::handle_request(Stream &strm, Request &req,
                                       Response &res, bool close_connection,
                                       Error &error) {
  if (req.path.empty()) {
    error = Error::Connection;
    return false;
  }

  auto req_save = req;

  bool ret;

  if (!is_ssl() && !proxy_host_.empty() && proxy_port_ != -1) {
    auto req2 = req;
    req2.path = "http://" + host_and_port_ + req.path;
    ret = process_request(strm, req2, res, close_connection, error);
    req = req2;
    req.path = req_save.path;
  } else {
    ret = process_request(strm, req, res, close_connection, error);
  }

  if (!ret) { return false; }

  if (300 < res.status && res.status < 400 && follow_location_) {
    req = req_save;
    ret = redirect(req, res, error);
  }

#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
  if ((res.status == 401 || res.status == 407) &&
      req.authorization_count_ < 5) {
    auto is_proxy = res.status == 407;
    const auto &username =
        is_proxy ? proxy_digest_auth_username_ : digest_auth_username_;
    const auto &password =
        is_proxy ? proxy_digest_auth_password_ : digest_auth_password_;

    if (!username.empty() && !password.empty()) {
      std::map<std::string, std::string> auth;
      if (detail::parse_www_authenticate(res, auth, is_proxy)) {
        Request new_req = req;
        new_req.authorization_count_ += 1;
        new_req.headers.erase(is_proxy ? "Proxy-Authorization"
                                       : "Authorization");
        new_req.headers.insert(detail::make_digest_authentication_header(
            req, auth, new_req.authorization_count_, detail::random_string(10),
            username, password, is_proxy));

        Response new_res;

        ret = send(new_req, new_res, error);
        if (ret) { res = new_res; }
      }
    }
  }
#endif

  return ret;
}